

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O0

ssize_t __thiscall diffusion::ShmReader::read(ShmReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int size;
  ErrorNoData *this_00;
  char *byte_pointer;
  undefined4 in_register_00000034;
  ShmReader *this_01;
  undefined1 local_40 [4];
  int body_size;
  vector<char,_std::allocator<char>_> body_size_buffer;
  ShmReader *this_local;
  vector<char,_std::allocator<char>_> *body;
  
  this_01 = (ShmReader *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (**(this_01->super_Reader)._vptr_Reader)();
  if ((uVar1 & 1) != 0) {
    cyclic_read((vector<char,_std::allocator<char>_> *)local_40,this_01,4);
    byte_pointer = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_40);
    size = read_aligned_object<int>(byte_pointer);
    cyclic_read((vector<char,_std::allocator<char>_> *)this,this_01,size);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_40);
    return (ssize_t)this;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,ErrorNoData::~ErrorNoData);
}

Assistant:

std::vector<char> ShmReader::read() {
    if (!this->can_read()) {
        throw ErrorNoData();
    }
    auto body_size_buffer = this->cyclic_read(sizeof(Size)); // avoid unaligned access.
    auto body_size = read_aligned_object<Size>(body_size_buffer.data());
    auto body = this->cyclic_read(body_size);
    return body;
}